

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectral_enumeration_map.cpp
# Opt level: O2

int main(void)

{
  uint8_t uVar1;
  uchar uVar2;
  static_truth_table<4U,_true> sVar3;
  iterator iVar4;
  mapped_type *pmVar5;
  ostream *poVar6;
  long lVar7;
  size_t i_1;
  ulong uVar8;
  __node_base *p_Var9;
  size_t i;
  ulong uVar10;
  int local_110;
  int local_10c;
  uint func_count;
  allocator_type local_101;
  int64_t index;
  static_truth_table<4U,_true> t2;
  static_truth_table<4U,_true> t1;
  dynamic_truth_table *local_e8;
  uint *local_e0;
  truth_table tt;
  __tuple_element_t<0UL,_tuple<static_truth_table<4U,_true>,_unsigned_int,_vector<unsigned_char,_allocator<unsigned_char>_>_>_>
  f_npn;
  vector<unsigned_char,_std::allocator<unsigned_char>_> perm;
  dynamic_truth_table map;
  truth_table_map classes;
  static_truth_table<4U,_true> spectral;
  
  kitty::dynamic_truth_table::dynamic_truth_table(&map,0x10);
  for (; map._bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start !=
         map._bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish;
      map._bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start =
           map._bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start + 1) {
    *map._bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
     super__Vector_impl_data._M_start =
         ~*map._bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  }
  classes._M_h._M_buckets = &classes._M_h._M_single_bucket;
  classes._M_h._M_bucket_count = 1;
  classes._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  classes._M_h._M_element_count = 0;
  classes._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  tt._bits = 0;
  classes._M_h._M_rehash_policy._M_next_resize = 0;
  classes._M_h._M_single_bucket = (__node_base_ptr)0x0;
  for (index = 0; index != -1;
      index = kitty::find_first_one_bit<kitty::dynamic_truth_table>(&map,index)) {
    std::__copy_move<false,false,std::random_access_iterator_tag>::__copy_m<long*,unsigned_long*>
              (&index,(long *)&t2,&tt._bits);
    func_count = 0;
    local_e0 = &func_count;
    t1._bits = tt._bits;
    t2._bits = (uint64_t)(~(uint)tt._bits & 0xffff);
    sVar3._bits = tt._bits;
    if (t2._bits < tt._bits) {
      sVar3._bits = t2._bits;
    }
    local_e8 = &map;
    main::$_1::operator()((__1 *)&local_e8,&t1);
    main::$_1::operator()((__1 *)&local_e8,&t2);
    local_110 = -1;
    for (uVar10 = 0; uVar10 < (ulong)(kitty::detail::swaps._56_8_ - kitty::detail::swaps._48_8_);
        uVar10 = uVar10 + 1) {
      uVar1 = *(uint8_t *)(kitty::detail::swaps._48_8_ + uVar10);
      kitty::swap_adjacent_inplace<4u>(&t1,uVar1);
      kitty::swap_adjacent_inplace<4u>(&t2,uVar1);
      main::$_1::operator()((__1 *)&local_e8,&t1);
      main::$_1::operator()((__1 *)&local_e8,&t2);
      if (t2._bits < sVar3._bits || t1._bits < sVar3._bits) {
        sVar3 = t1;
        if (t2._bits < t1._bits) {
          sVar3 = t2;
        }
        local_110 = (int)uVar10;
      }
    }
    local_10c = -1;
    for (uVar10 = 0; uVar10 < (ulong)(kitty::detail::flips._56_8_ - kitty::detail::flips._48_8_);
        uVar10 = uVar10 + 1) {
      uVar1 = *(uint8_t *)(kitty::detail::flips._48_8_ + uVar10);
      kitty::swap_adjacent_inplace<4u>(&t1,'\0');
      kitty::flip_inplace<4u>(&t1,uVar1);
      kitty::swap_adjacent_inplace<4u>(&t2,'\0');
      kitty::flip_inplace<4u>(&t2,uVar1);
      main::$_1::operator()((__1 *)&local_e8,&t1);
      main::$_1::operator()((__1 *)&local_e8,&t2);
      if (t2._bits < sVar3._bits || t1._bits < sVar3._bits) {
        sVar3 = t1;
        if (t2._bits < t1._bits) {
          sVar3 = t2;
        }
        local_110 = -1;
        local_10c = (int)uVar10;
      }
      for (uVar8 = 0; uVar8 < (ulong)(kitty::detail::swaps._56_8_ - kitty::detail::swaps._48_8_);
          uVar8 = uVar8 + 1) {
        uVar1 = *(uint8_t *)(kitty::detail::swaps._48_8_ + uVar8);
        kitty::swap_adjacent_inplace<4u>(&t1,uVar1);
        kitty::swap_adjacent_inplace<4u>(&t2,uVar1);
        main::$_1::operator()((__1 *)&local_e8,&t1);
        main::$_1::operator()((__1 *)&local_e8,&t2);
        if (t2._bits < sVar3._bits || t1._bits < sVar3._bits) {
          sVar3 = t1;
          if (t2._bits < t1._bits) {
            sVar3 = t2;
          }
          local_110 = (int)uVar8;
          local_10c = (int)uVar10;
        }
      }
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &perm.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>,4,&local_101)
    ;
    for (lVar7 = 0;
        perm.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start + lVar7 !=
        perm.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish; lVar7 = lVar7 + 1) {
      perm.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[lVar7] = (uchar)lVar7;
    }
    if (local_110 < 0) {
      local_110 = -1;
    }
    for (lVar7 = 0; (long)local_110 + 1 != lVar7; lVar7 = lVar7 + 1) {
      uVar10 = (ulong)*(byte *)(kitty::detail::swaps._48_8_ + lVar7);
      uVar2 = perm.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start[uVar10];
      perm.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[uVar10] =
           perm.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start[uVar10 + 1];
      perm.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[uVar10 + 1] = uVar2;
    }
    if (local_10c < 0) {
      local_10c = -1;
    }
    for (lVar7 = 0; (long)local_10c + 1 != lVar7; lVar7 = lVar7 + 1) {
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&spectral,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &perm.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&perm.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    f_npn._bits = sVar3._bits;
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&spectral);
    spectral = kitty::
               exact_spectral_canonization<kitty::static_truth_table<4u,true>,void(std::vector<kitty::detail::spectral_operation,std::allocator<kitty::detail::spectral_operation>>const&)>
                         (&f_npn,kitty::detail::exact_spectral_canonization_null_callback);
    iVar4 = std::
            _Hashtable<kitty::static_truth_table<4U,_true>,_std::pair<const_kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::__detail::_Select1st,_std::equal_to<kitty::static_truth_table<4U,_true>_>,_kitty::hash<kitty::static_truth_table<4U,_true>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&classes._M_h,(key_type *)&spectral);
    if (iVar4.
        super__Node_iterator_base<std::pair<const_kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      uVar10 = (ulong)func_count;
      pmVar5 = std::__detail::
               _Map_base<kitty::static_truth_table<4U,_true>,_std::pair<const_kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::__detail::_Select1st,_std::equal_to<kitty::static_truth_table<4U,_true>_>,_kitty::hash<kitty::static_truth_table<4U,_true>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<kitty::static_truth_table<4U,_true>,_std::pair<const_kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::__detail::_Select1st,_std::equal_to<kitty::static_truth_table<4U,_true>_>,_kitty::hash<kitty::static_truth_table<4U,_true>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&classes,(key_type *)&spectral);
      pmVar5->first = 1;
      pmVar5->second = uVar10;
    }
    else {
      *(long *)((long)iVar4.
                      super__Node_iterator_base<std::pair<const_kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>_>,_true>
                      ._M_cur + 0x10) =
           *(long *)((long)iVar4.
                           super__Node_iterator_base<std::pair<const_kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>_>,_true>
                           ._M_cur + 0x10) + 1;
      *(ulong *)((long)iVar4.
                       super__Node_iterator_base<std::pair<const_kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>_>,_true>
                       ._M_cur + 0x18) =
           (ulong)func_count +
           *(long *)((long)iVar4.
                           super__Node_iterator_base<std::pair<const_kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>_>,_true>
                           ._M_cur + 0x18);
    }
  }
  poVar6 = std::operator<<((ostream *)&std::cout,"[i] enumerated ");
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  poVar6 = std::operator<<(poVar6," functions into ");
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  poVar6 = std::operator<<(poVar6," classes.");
  std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = std::operator<<((ostream *)&std::cout,"[i] detailed classes:");
  std::endl<char,std::char_traits<char>>(poVar6);
  p_Var9 = &classes._M_h._M_before_begin;
  while (p_Var9 = p_Var9->_M_nxt, p_Var9 != (__node_base *)0x0) {
    kitty::print_hex<kitty::static_truth_table<4u,true>,void>
              ((static_truth_table<4U,_true> *)(p_Var9 + 1),(ostream *)&std::cout);
    std::operator<<((ostream *)&std::cout,"   ");
    kitty::print_spectrum<kitty::static_truth_table<4u,true>>
              ((static_truth_table<4U,_true> *)(p_Var9 + 1),(ostream *)&std::cout);
    poVar6 = std::operator<<((ostream *)&std::cout," ");
    *(undefined8 *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x10) = 8;
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    poVar6 = std::operator<<(poVar6," ");
    *(undefined8 *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x10) = 8;
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::endl<char,std::char_traits<char>>(poVar6);
  }
  std::
  _Hashtable<kitty::static_truth_table<4U,_true>,_std::pair<const_kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::__detail::_Select1st,_std::equal_to<kitty::static_truth_table<4U,_true>_>,_kitty::hash<kitty::static_truth_table<4U,_true>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&classes._M_h);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&map);
  return 0;
}

Assistant:

int main()
{
  static_assert( num_vars <= 5, "number of variables is limited to 5" );

  /* set to store all visited functions during NPN canonization (dynamic to store bits on heap) */
  kitty::dynamic_truth_table map( truth_table::NumBits );

  /* invert bits: 1 means not classified yet */
  std::transform( map.cbegin(), map.cend(), map.begin(), []( auto word ) { return ~word; } );

  /* set to store all NPN and spectral representatives */
  using truth_table_map = std::unordered_map<truth_table, std::pair<uint64_t, uint64_t>, kitty::hash<truth_table>>;
  truth_table_map classes;

  /* start from 0 */
  int64_t index = 0;
  truth_table tt;

  /* for counting the classes and functions */
  //uint64_t ones = map.num_bits();

  auto ctr = 0, bctr = 0;

  while ( index != -1 )
  {
    /* create truth table from index value */
    kitty::create_from_words( tt, &index, &index + 1 );

    /* apply NPN canonization and add resulting representative to set;
       also cross out all the visited functions */
    auto func_count = 0u;
    const auto f_npn = std::get<0>( kitty::exact_npn_canonization( tt,
                                                                   [&map, &func_count]( const auto& tt ) {
                                                                     func_count += kitty::get_bit( map, *tt.cbegin() );
                                                                     kitty::clear_bit( map, *tt.cbegin() ); } ) );

    //auto new_ones = count_ones( map );
    //auto func_count = ones - new_ones;
    //ones = new_ones;

    const auto spectral = kitty::exact_spectral_canonization( f_npn );

    auto it = classes.find( spectral );

    if ( it == classes.end() )
    {
      classes[spectral] = {1u, func_count};
    }
    else
    {
      it->second.first++;
      it->second.second += func_count;
    }

    if ( progress )
    {
      std::cout << ".";

      if ( ++ctr == 100 )
      {
        std::cout << " " << ++bctr << std::endl;
        ctr = 0;
      }
    }

    /* find next non-classified truth table */
    index = find_first_one_bit( map, index );
  }

  if ( progress )
  {
    std::cout << std::endl;
  }

  std::cout << "[i] enumerated "
            << map.num_bits() << " functions into "
            << classes.size() << " classes." << std::endl;

  std::cout << "[i] detailed classes:" << std::endl;

  for ( const auto& p : classes )
  {
    print_hex( p.first );
    std::cout << "   ";
    print_spectrum( p.first );
    std::cout << " " << std::setw( 8 ) << p.second.first << " " << std::setw( 8 ) << p.second.second << std::endl;
  }

  return 0;
}